

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

SubroutineSymbol * __thiscall
slang::ast::MethodPrototypeSymbol::getSubroutine(MethodPrototypeSymbol *this)

{
  string_view declName;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view className;
  bool bVar1;
  DiagCode DVar2;
  Scope *this_00;
  Symbol *this_01;
  SourceLocation noteLocation;
  Compilation *pCVar3;
  SubroutineSymbol **ppSVar4;
  Symbol *in_RDI;
  SymbolIndex in_stack_00000034;
  Scope *in_stack_00000038;
  Scope *in_stack_00000040;
  MethodPrototypeSymbol *in_stack_00000048;
  FunctionDeclarationSyntax *in_stack_00000050;
  Compilation *in_stack_00000058;
  SubroutineSymbol *in_stack_00000088;
  Scope *in_stack_00000090;
  Diagnostic *diag_1;
  Diagnostic *diag;
  FunctionDeclarationSyntax *syntax;
  type *used;
  type *index;
  type *declSyntax;
  Compilation *comp;
  Scope *outerScope;
  Symbol *parentSym;
  Scope *nearScope;
  void **in_stack_fffffffffffffe68;
  bitmask<slang::ast::MethodFlags> *r;
  optional<const_slang::ast::SubroutineSymbol_*> *in_stack_fffffffffffffe70;
  Diagnostic *this_02;
  SourceLocation in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  DiagCode in_stack_fffffffffffffe84;
  DiagCode DVar5;
  MethodPrototypeSymbol *in_stack_fffffffffffffea8;
  Compilation *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  SyntaxNode *in_stack_fffffffffffffec0;
  Token local_120;
  SourceLocation local_110;
  undefined4 local_104;
  Diagnostic *local_100;
  size_t local_f8;
  Scope *in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  DiagCode in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff40 [16];
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  bitmask<slang::ast::MethodFlags> local_9a;
  FunctionDeclarationSyntax *local_98;
  __tuple_element_t<2UL,_tuple<const_SyntaxNode_*,_SymbolIndex,_bool_*>_> *local_90;
  DiagCode *local_88;
  __tuple_element_t<0UL,_tuple<const_SyntaxNode_*,_SymbolIndex,_bool_*>_> *local_80;
  bitmask<slang::ast::MethodFlags> *local_78;
  Diagnostic *local_70;
  size_t local_68;
  char *local_60;
  Scope *in_stack_ffffffffffffffa8;
  SourceRange in_stack_ffffffffffffffb0;
  SubroutineSymbol *local_8;
  
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<const_slang::ast::SubroutineSymbol_*> *)0x4a6a8f);
  if (bVar1) {
    if ((in_RDI[3].indexInScope & 1) != 0) {
      *(undefined1 *)&in_RDI[3].indexInScope = 0;
      Symbol::getParentScope(in_RDI);
      std::optional<const_slang::ast::SubroutineSymbol_*>::value(in_stack_fffffffffffffe70);
      bVar1 = checkMethodMatch((MethodPrototypeSymbol *)diag_1,in_stack_00000090,in_stack_00000088);
      if (!bVar1) {
        std::optional<slang::ast::SubroutineSymbol_const*>::operator=
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
    }
    ppSVar4 = std::optional<const_slang::ast::SubroutineSymbol_*>::operator*
                        ((optional<const_slang::ast::SubroutineSymbol_*> *)0x4a6b1b);
    local_8 = *ppSVar4;
  }
  else {
    std::optional<slang::ast::SubroutineSymbol_const*>::operator=
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name);
    if (bVar1) {
      ppSVar4 = std::optional<const_slang::ast::SubroutineSymbol_*>::operator*
                          ((optional<const_slang::ast::SubroutineSymbol_*> *)0x4a6b75);
      local_8 = *ppSVar4;
    }
    else {
      this_00 = Symbol::getParentScope(in_RDI);
      this_01 = Scope::asSymbol(this_00);
      noteLocation = (SourceLocation)Symbol::getParentScope(this_01);
      pCVar3 = Scope::getCompilation((Scope *)noteLocation);
      DVar5 = SUB84((ulong)pCVar3 >> 0x20,0);
      local_68 = (this_01->name)._M_len;
      local_60 = (this_01->name)._M_str;
      r = (bitmask<slang::ast::MethodFlags> *)(in_RDI->name)._M_len;
      this_02 = (Diagnostic *)(in_RDI->name)._M_str;
      className._M_len._4_4_ = in_stack_ffffffffffffff54;
      className._M_len._0_4_ = in_stack_ffffffffffffff50;
      className._M_str = in_stack_ffffffffffffff58;
      declName._M_str = (char *)in_stack_00000048;
      declName._M_len = (size_t)in_stack_00000040;
      local_78 = r;
      local_70 = this_02;
      Compilation::findOutOfBlockDecl
                (in_stack_ffffffffffffff40._8_8_,in_stack_ffffffffffffff40._0_8_,className,declName)
      ;
      local_80 = std::get<0ul,slang::syntax::SyntaxNode_const*,slang::ast::SymbolIndex,bool*>
                           ((tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                             *)0x4a6c67);
      local_88 = (DiagCode *)
                 std::get<1ul,slang::syntax::SyntaxNode_const*,slang::ast::SymbolIndex,bool*>
                           ((tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                             *)0x4a6c7c);
      local_90 = std::get<2ul,slang::syntax::SyntaxNode_const*,slang::ast::SymbolIndex,bool*>
                           ((tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                             *)0x4a6c91);
      local_98 = (FunctionDeclarationSyntax *)0x0;
      if ((*local_80 != (__tuple_element_t<0UL,_tuple<const_SyntaxNode_*,_SymbolIndex,_bool_*>_>)0x0
          ) && (((*local_80)->kind == FunctionDeclaration || ((*local_80)->kind == TaskDeclaration))
               )) {
        local_98 = slang::syntax::SyntaxNode::as<slang::syntax::FunctionDeclarationSyntax>
                             (*local_80);
        **local_90 = true;
      }
      bitmask<slang::ast::MethodFlags>::bitmask(&local_9a,Pure);
      bVar1 = bitmask<slang::ast::MethodFlags>::has((bitmask<slang::ast::MethodFlags> *)this_02,r);
      if (bVar1) {
        if (local_98 == (FunctionDeclarationSyntax *)0x0) {
          SubroutineSymbol::createFromPrototype
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(Scope *)in_RDI);
          std::optional<slang::ast::SubroutineSymbol_const*>::operator=
                    ((optional<const_slang::ast::SubroutineSymbol_*> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (SubroutineSymbol **)in_stack_fffffffffffffe78);
        }
        else {
          not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                    ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x4a6d76);
          not_null<slang::syntax::NameSyntax_*>::operator->
                    ((not_null<slang::syntax::NameSyntax_*> *)0x4a6d82);
          slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffec0);
          Scope::addDiag(in_stack_ffffffffffffffa8,DVar5,in_stack_ffffffffffffffb0);
          Diagnostic::addNote(this_02,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78);
        }
        ppSVar4 = std::optional<const_slang::ast::SubroutineSymbol_*>::operator*
                            ((optional<const_slang::ast::SubroutineSymbol_*> *)0x4a6e4e);
        local_8 = *ppSVar4;
      }
      else if (local_98 == (FunctionDeclarationSyntax *)0x0) {
        Scope::addDiag(in_stack_ffffffffffffff10,(DiagCode)0x8b0006,in_RDI->location);
        local_f8 = (in_RDI->name)._M_len;
        arg._M_len._4_4_ = in_stack_fffffffffffffebc;
        arg._M_len._0_4_ = in_stack_fffffffffffffeb8;
        arg._M_str = (char *)in_stack_fffffffffffffec0;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffeb0,arg);
        local_8 = (SubroutineSymbol *)0x0;
      }
      else {
        DVar5 = *local_88;
        DVar2 = (DiagCode)Symbol::getIndex(this_01);
        if ((uint)DVar5 <= (uint)DVar2) {
          local_104 = 0x6e0006;
          not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
                    ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x4a6f41);
          not_null<slang::syntax::NameSyntax_*>::operator->
                    ((not_null<slang::syntax::NameSyntax_*> *)0x4a6f4d);
          local_120 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_RDI);
          local_110 = parsing::Token::location(&local_120);
          local_100 = Scope::addDiag(in_stack_ffffffffffffff10,in_stack_ffffffffffffff24,
                                     in_stack_ffffffffffffff18);
          arg_00._M_len._4_4_ = in_stack_fffffffffffffebc;
          arg_00._M_len._0_4_ = in_stack_fffffffffffffeb8;
          arg_00._M_str = (char *)in_stack_fffffffffffffec0;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffeb0,arg_00);
          arg_01._M_len._4_4_ = in_stack_fffffffffffffebc;
          arg_01._M_len._0_4_ = in_stack_fffffffffffffeb8;
          arg_01._M_str = (char *)(this_01->name)._M_len;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffeb0,arg_01);
          Diagnostic::addNote(this_02,DVar5,noteLocation);
          in_stack_fffffffffffffe78 = noteLocation;
        }
        SubroutineSymbol::createOutOfBlock
                  (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                   in_stack_00000038,in_stack_00000034);
        std::optional<slang::ast::SubroutineSymbol_const*>::operator=
                  ((optional<const_slang::ast::SubroutineSymbol_*> *)
                   CONCAT44(DVar5,in_stack_fffffffffffffe80),
                   (SubroutineSymbol **)in_stack_fffffffffffffe78);
        ppSVar4 = std::optional<const_slang::ast::SubroutineSymbol_*>::operator*
                            ((optional<const_slang::ast::SubroutineSymbol_*> *)0x4a7084);
        local_8 = *ppSVar4;
      }
    }
  }
  return local_8;
}

Assistant:

const SubroutineSymbol* MethodPrototypeSymbol::getSubroutine() const {
    SLANG_ASSERT(getParentScope() && getParentScope()->asSymbol().getParentScope());

    if (subroutine) {
        if (needsMatchCheck) {
            needsMatchCheck = false;
            if (!checkMethodMatch(*getParentScope(), *subroutine.value()))
                subroutine = nullptr;
        }
        return *subroutine;
    }

    subroutine = nullptr;
    if (name.empty())
        return *subroutine;

    auto& nearScope = *getParentScope();
    auto& parentSym = nearScope.asSymbol();
    auto& outerScope = *parentSym.getParentScope();
    auto& comp = outerScope.getCompilation();

    SLANG_ASSERT(!flags.has(MethodFlags::ModportImport | MethodFlags::ModportExport |
                            MethodFlags::InterfaceExtern));

    // The out-of-block definition must be in our parent scope.
    auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
    const FunctionDeclarationSyntax* syntax = nullptr;
    if (declSyntax && (declSyntax->kind == SyntaxKind::FunctionDeclaration ||
                       declSyntax->kind == SyntaxKind::TaskDeclaration)) {
        syntax = &declSyntax->as<FunctionDeclarationSyntax>();
        *used = true;
    }

    if (flags.has(MethodFlags::Pure)) {
        // A pure method should not have a body defined.
        if (syntax) {
            auto& diag = outerScope.addDiag(diag::BodyForPure,
                                            syntax->prototype->name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
        }
        else {
            // Create a stub subroutine that we can return for callers to reference.
            subroutine = &SubroutineSymbol::createFromPrototype(comp, *this, nearScope);
        }
        return *subroutine;
    }

    // Otherwise, there must be a body for any declared prototype.
    if (!syntax) {
        outerScope.addDiag(diag::NoMemberImplFound, location) << name;
        return nullptr;
    }

    // The method definition must be located after the class definition.
    if (index <= parentSym.getIndex()) {
        auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                        syntax->prototype->name->getLastToken().location());
        diag << name << parentSym.name;
        diag.addNote(diag::NoteDeclarationHere, parentSym.location);
    }

    subroutine = &SubroutineSymbol::createOutOfBlock(comp, *syntax, *this, nearScope, outerScope,
                                                     index);
    return *subroutine;
}